

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ParsedOptions options;
  Crypt crypt;
  SequenceD<64> k1;
  Parser parser;
  ParsedOptions local_3d8;
  Crypt local_370;
  pair<SequenceD<64>,_SequenceD<64>_> local_210;
  Parser local_b0;
  
  Parser::Parser(&local_b0,argc,argv);
  Parser::parse(&local_3d8,&local_b0);
  iVar1 = 1;
  if (local_3d8.error != false) goto switchD_0010435b_default;
  iVar1 = 0;
  switch(local_3d8.command) {
  case HELP:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage:",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "       3des [--key-gen] [-i <fichier>] [-c <fichier>] [-d <fichier>] [-O <fichier>]"
               ,0x53);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Arguments:",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  --key-gen",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "       Permet de generer une nouvelle clef de chiffrement et l\'affiche sur la sortie standard."
               ,0x5e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  -i <fichier>",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "       Permet de specifier une clef utilisee pour le chiffrement ou le dechiffrement."
               ,0x55);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  -c <fichier>",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "       Permet de chiffrer un fichier a l\'aide d\'une clef (specifiee par le flag -i)."
               ,0x54);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"       Par defaut, ecrit le resultat dans la sortie standard."
               ,0x3d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  -d <fichier>",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "       Permet de dechiffrer un fichier a l\'aide d\'une clef (specifiee par le flag -i)."
               ,0x56);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"       Par defaut, ecrit le resultat dans la sortie standard."
               ,0x3d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  -O <fichier>",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "      Permet d\'ecrire le resultat d\'une sous commande vers un nouveau fichier plutot que"
               ,0x58);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      dans la sortie standard.",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  -h / --help",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Affiche ce message d\'aide et se termine.",0x2e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Exemple:",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      ./3des -i ~/3des.key -c README.txt > README.3des",0x36);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    iVar1 = 0;
    break;
  case KEY_GEN:
    SequenceD<64>::SequenceD(&local_210.first);
    SequenceD<64>::SequenceD(&local_370.m_k1);
    if (local_3d8.outputFile._M_string_length == 0) {
      write3DESKeys((ostream *)&std::cout,&local_210.first,&local_370.m_k1);
    }
    else {
      write3DESKeys(&local_3d8.outputFile,&local_210.first,&local_370.m_k1);
    }
    local_370.m_k1.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
    local_370.m_k1.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_370.m_k1.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_370.m_k1.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_370.m_k1.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_210.first.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
    local_210.first.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_210.first.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_210.first.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_210.first.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    iVar1 = 0;
    break;
  case CYPHER:
    read3DESKeys(&local_210,&local_3d8.keyFile);
    Crypt::Crypt(&local_370,&local_210.first,&local_210.second);
    if (local_3d8.outputFile._M_string_length == 0) {
      Crypt::operator()(&local_370,&local_3d8.inputFile,(ostream *)&std::cout);
    }
    else {
      Crypt::operator()(&local_370,&local_3d8.inputFile,&local_3d8.outputFile);
    }
    goto LAB_00104be8;
  case DECYPHER:
    read3DESKeys(&local_210,&local_3d8.keyFile);
    Decrypt::Decrypt((Decrypt *)&local_370,&local_210.first,&local_210.second);
    if (local_3d8.outputFile._M_string_length == 0) {
      Decrypt::operator()((Decrypt *)&local_370,&local_3d8.inputFile,(ostream *)&std::cout);
    }
    else {
      Decrypt::operator()((Decrypt *)&local_370,&local_3d8.inputFile,&local_3d8.outputFile);
    }
LAB_00104be8:
    local_370.m_k2.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
    local_370.m_k2.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_370.m_k2.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_370.m_k2.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_370.m_k2.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_370.m_k1.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
    local_370.m_k1.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_370.m_k1.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_370.m_k1.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_370.m_k1.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_210.second.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
    local_210.second.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_210.second.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_210.second.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_210.second.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>)
    ;
    local_210.first.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
    local_210.first.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_210.first.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_210.first.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_210.first.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    iVar1 = 0;
  }
switchD_0010435b_default:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.outputFile._M_dataplus._M_p != &local_3d8.outputFile.field_2) {
    operator_delete(local_3d8.outputFile._M_dataplus._M_p,
                    local_3d8.outputFile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.inputFile._M_dataplus._M_p != &local_3d8.inputFile.field_2) {
    operator_delete(local_3d8.inputFile._M_dataplus._M_p,
                    local_3d8.inputFile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.keyFile._M_dataplus._M_p != &local_3d8.keyFile.field_2) {
    operator_delete(local_3d8.keyFile._M_dataplus._M_p,
                    local_3d8.keyFile.field_2._M_allocated_capacity + 1);
  }
  Parser::~Parser(&local_b0);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
    Parser parser(argc, argv);
    auto options = parser.parse();

    if (options.error) {
        return EXIT_FAILURE;
    }

    switch (options.command) {
        case HELP:
            std::cout << "Usage:" << std::endl;
            std::cout << std::endl;
            std::cout << "       3des [--key-gen] [-i <fichier>] [-c <fichier>] [-d <fichier>] [-O <fichier>]" << std::endl;
            std::cout << std::endl;
            std::cout << "Arguments:" << std::endl;
            std::cout << std::endl;
            std::cout << "  --key-gen" << std::endl;
            std::cout << "       Permet de generer une nouvelle clef de chiffrement et l'affiche sur la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -i <fichier>" << std::endl;
            std::cout << "       Permet de specifier une clef utilisee pour le chiffrement ou le dechiffrement." << std::endl;
            std::cout << std::endl;
            std::cout << "  -c <fichier>" << std::endl;
            std::cout << "       Permet de chiffrer un fichier a l'aide d'une clef (specifiee par le flag -i)." << std::endl;
            std::cout << "       Par defaut, ecrit le resultat dans la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -d <fichier>" << std::endl;
            std::cout << "       Permet de dechiffrer un fichier a l'aide d'une clef (specifiee par le flag -i)." << std::endl;
            std::cout << "       Par defaut, ecrit le resultat dans la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -O <fichier>" << std::endl;
            std::cout << "      Permet d'ecrire le resultat d'une sous commande vers un nouveau fichier plutot que" << std::endl;
            std::cout << "      dans la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -h / --help" << std::endl;
            std::cout << "      Affiche ce message d'aide et se termine." << std::endl;
            std::cout << std::endl;
            std::cout << "Exemple:" << std::endl;
            std::cout << std::endl;
            std::cout << "      ./3des -i ~/3des.key -c README.txt > README.3des" << std::endl;
            std::cout << std::endl;
            break;
        case KEY_GEN: {
            SequenceD<64> k1{}, k2{};
            if (options.outputFile.empty()) {
                write3DESKeys(std::cout, k1, k2);
            } else {
                write3DESKeys(options.outputFile, k1, k2);
            }
        } break;
        case CYPHER: {
            auto [k1, k2] = read3DESKeys(options.keyFile);
            Crypt crypt(k1, k2);
            if (options.outputFile.empty()) {
                crypt(options.inputFile, std::cout);
            } else {
                crypt(options.inputFile, options.outputFile);
            }
        } break;
        case DECYPHER: {
            auto [k1, k2] = read3DESKeys(options.keyFile);
            Decrypt decrypt(k1, k2);
            if (options.outputFile.empty()) {
                decrypt(options.inputFile, std::cout);
            } else {
                decrypt(options.inputFile, options.outputFile);
            }
        } break;
        case NONE:
        default:
            break;
    }

    return EXIT_SUCCESS;
}